

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::Assembler::_emitFailed
          (Assembler *this,Error err,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,
          Operand_ *o2,Operand_ *o3)

{
  Error EVar1;
  char *str;
  Detail local_1c8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_1b8;
  UInt64 local_1a8;
  anon_union_8_2_78723da6_for_MemData_2 aStack_1a0;
  UInt64 local_198;
  anon_union_8_2_78723da6_for_MemData_2 aStack_190;
  UInt64 local_188;
  anon_union_8_2_78723da6_for_MemData_2 aStack_180;
  undefined1 local_178 [32];
  StringBuilderTmp<256UL> sb;
  
  sb.super_StringBuilder._data = sb._embeddedData;
  sb._embeddedData[0] = '\0';
  sb.super_StringBuilder._length = 0;
  sb.super_StringBuilder._capacity = 0x100;
  sb.super_StringBuilder._canFree = 0;
  str = DebugUtils::errorAsString(err);
  StringBuilder::_opString(&sb.super_StringBuilder,1,str,0xffffffffffffffff);
  StringBuilder::_opString(&sb.super_StringBuilder,1,": ",0xffffffffffffffff);
  local_1b8._packed[0].field_10 = (o0->field_0)._packed[0];
  local_1b8._mem.field_2 = (o0->field_0)._mem.field_2;
  local_1a8 = (o1->field_0)._packed[0];
  aStack_1a0 = (o1->field_0)._mem.field_2;
  local_198 = (o2->field_0)._packed[0];
  aStack_190 = (o2->field_0)._mem.field_2;
  local_188 = (o3->field_0)._packed[0];
  aStack_180 = (o3->field_0)._mem.field_2;
  if ((options & 8) == 0) {
    local_178 = ZEXT832(0) << 0x20;
  }
  else {
    local_178._0_16_ = *(undefined1 (*) [16])&this->_op4;
    local_178._16_16_ = *(undefined1 (*) [16])&this->_op5;
  }
  local_1c8.extraReg = (this->super_CodeEmitter)._extraReg;
  local_1c8.instId = instId;
  local_1c8.options = options;
  Logging::formatInstruction
            (&sb.super_StringBuilder,0,&this->super_CodeEmitter,
             (uint)(this->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,&local_1c8,
             (Operand_ *)&local_1b8._any,6);
  *(undefined4 *)((long)&(this->super_CodeEmitter)._inlineComment + 4) = 0;
  (this->super_CodeEmitter)._options = 0;
  (this->super_CodeEmitter)._extraReg._signature = 0;
  *(undefined8 *)&(this->super_CodeEmitter)._extraReg._id = 0;
  EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,err,sb.super_StringBuilder._data);
  StringBuilder::~StringBuilder(&sb.super_StringBuilder);
  return EVar1;
}

Assistant:

Error Assembler::_emitFailed(
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {

  StringBuilderTmp<256> sb;
  sb.appendString(DebugUtils::errorAsString(err));
  sb.appendString(": ");

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, 0,
    this, getArchType(),
    Inst::Detail(instId, options, _extraReg), opArray, 6);

  resetOptions();
  resetExtraReg();
  resetInlineComment();
  return setLastError(err, sb.getData());
}